

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O0

address __thiscall
pstore::index::
hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
::store_leaf_node<std::pair<std::__cxx11::string,std::__cxx11::string>>
          (hamt_map<std::__cxx11::string,std::__cxx11::string,(anonymous_namespace)::hash_function,std::equal_to<std::__cxx11::string>>
           *this,transaction_base *transaction,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *v,not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents)

{
  int iVar1;
  undefined4 extraout_var;
  value_type vVar2;
  array_stack<pstore::index::details::parent_type,_13UL> *this_00;
  index_pointer local_88;
  parent_type local_80 [2];
  database_writer local_60;
  undefined8 local_40;
  undefined8 local_38;
  size_t aligned_to;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *v_local;
  transaction_base *transaction_local;
  hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*> parents_local;
  address result;
  
  local_38 = 4;
  aligned_to = (size_t)v;
  v_local = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)transaction;
  transaction_local = (transaction_base *)this;
  this_local = (hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)parents.ptr_;
  iVar1 = (*transaction->_vptr_transaction_base[2])(transaction,0,4);
  local_40 = CONCAT44(extraout_var,iVar1);
  serialize::archive::make_writer(&local_60,(transaction_base *)v_local);
  parents_local.ptr_ =
       (array_stack<pstore::index::details::parent_type,_13UL> *)
       serialize::
       write<pstore::serialize::archive::database_writer,std::pair<std::__cxx11::string,std::__cxx11::string>>
                 (&local_60,
                  (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)aligned_to);
  serialize::archive::database_writer::~database_writer(&local_60);
  vVar2 = address::absolute((address *)&parents_local);
  if ((vVar2 & 3) == 0) {
    this_00 = gsl::not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>::
              operator->((not_null<pstore::array_stack<pstore::index::details::parent_type,_13UL>_*>
                          *)&this_local);
    details::index_pointer::index_pointer
              ((index_pointer *)&local_88.addr_,(address)parents_local.ptr_);
    details::parent_type::parent_type(local_80,local_88,0xffffffffffffffff);
    array_stack<pstore::index::details::parent_type,_13UL>::push(this_00,local_80);
    return (address)(value_type)parents_local.ptr_;
  }
  assert_failed("(result.absolute () & (aligned_to - 1U)) == 0U",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                ,0x2d5);
}

Assistant:

address hamt_map<KeyType, ValueType, Hash, KeyEqual>::store_leaf_node (
            transaction_base & transaction, OtherValueType const & v,
            gsl::not_null<parent_stack *> const parents) {

            // Make sure the alignment of leaf node is 4 to ensure that the two LSB are guaranteed
            // 0. If 'v' has greater alignment, serialize::write() will add additional padding.
            constexpr auto aligned_to = std::size_t{4};
            static_assert ((details::internal_node_bit | details::heap_node_bit) == aligned_to - 1,
                           "expected required alignment to be 4");
            transaction.allocate (0, aligned_to);

            // Now write the node and return where it went.
            address const result =
                serialize::write (serialize::archive::make_writer (transaction), v);
            PSTORE_ASSERT ((result.absolute () & (aligned_to - 1U)) == 0U);
            parents->push (details::parent_type{index_pointer{result}});

            return result;
        }